

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# experiment_helpers.cpp
# Opt level: O3

void opengv::generateMulti2D2DCorrespondences
               (translation_t *position1,rotation_t *rotation1,translation_t *position2,
               rotation_t *rotation2,translations_t *camOffsets,rotations_t *camRotations,
               size_t pointsPerCam,double noise,double outlierFraction,
               vector<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>,_std::allocator<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>_>_>
               *multiBearingVectors1,
               vector<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>,_std::allocator<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>_>_>
               *multiBearingVectors2,
               vector<std::shared_ptr<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_std::allocator<std::shared_ptr<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
               *gt)

{
  double *pdVar1;
  double *pdVar2;
  pointer pMVar3;
  long *plVar4;
  long lVar5;
  iterator iVar6;
  double dVar7;
  translations_t *ptVar8;
  element_type *peVar9;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  DenseStorage<double,__1,__1,__1,_0> *this;
  void *pvVar16;
  pointer pMVar17;
  undefined8 *puVar18;
  pointer pMVar19;
  ulong uVar20;
  long lVar21;
  double dVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  long lVar26;
  double dVar27;
  long lVar28;
  size_t sVar29;
  ulong uVar30;
  double dVar31;
  undefined1 auVar32 [16];
  double dVar35;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  double dVar42;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 in_ZMM4 [64];
  shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
  bearingVectors2;
  value_type local_1d8;
  Vector3d local_1c8;
  double local_1b0;
  translations_t *local_1a8;
  double local_1a0;
  value_type local_198;
  double local_188;
  double dStack_180;
  ulong local_170;
  double local_168;
  double dStack_160;
  double local_158;
  double dStack_150;
  rotations_t *local_148;
  rotation_t *local_140;
  double local_138;
  double dStack_130;
  undefined1 local_128 [16];
  undefined1 local_118 [16];
  double local_108;
  double dStack_100;
  double local_f8;
  double dStack_f0;
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  double local_c8;
  double dStack_c0;
  double local_b8;
  double dStack_b0;
  double local_a8;
  double dStack_a0;
  double local_98;
  rotation_t *local_90;
  double local_88;
  double dStack_80;
  double local_78;
  double dStack_70;
  Vector3d local_68;
  Vector3d local_48;
  
  pMVar17 = (camOffsets->
            super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pMVar19 = (camOffsets->
            super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  local_1b0 = noise;
  local_1a8 = camOffsets;
  local_148 = camRotations;
  local_98 = outlierFraction;
  local_90 = rotation1;
  if (pMVar19 != pMVar17) {
    local_168 = (double)(pointsPerCam * 3);
    uVar30 = 0;
    do {
      local_188 = (double)uVar30;
      this = (DenseStorage<double,__1,__1,__1,_0> *)
             Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator_new
                       ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)0x18,
                        (size_t)rotation1);
      this->m_cols = 0;
      this->m_data = (double *)0x0;
      this->m_rows = 0;
      if ((pointsPerCam != 0) &&
         (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) / SEXT816((long)pointsPerCam),0)
          < 3)) {
        puVar18 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar18 = srand;
        __cxa_throw(puVar18,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
      }
      Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(this,(Index)local_168,3,pointsPerCam);
      local_1d8.
      super___shared_ptr<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)this;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<Eigen::Matrix<double,_1,_1,0,_1,_1>*>
                (&local_1d8.
                  super___shared_ptr<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount,(Matrix<double,__1,__1,_0,__1,__1> *)this);
      auVar32 = in_ZMM4._0_16_;
      if (pointsPerCam != 0) {
        lVar26 = 0;
        sVar29 = 0;
        do {
          in_ZMM4 = ZEXT1664(in_ZMM4._0_16_);
          generateRandomPoint(&local_1c8,8.0,4.0);
          auVar32 = in_ZMM4._0_16_;
          pdVar2 = *(double **)
                    &(local_1d8.
                      super___shared_ptr<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr)->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>;
          uVar30 = *(Index *)((long)local_1d8.
                                    super___shared_ptr<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr + 8);
          uVar23 = uVar30;
          if ((((ulong)(pdVar2 + uVar30 * sVar29) & 7) == 0) &&
             (uVar23 = (ulong)(-((uint)((ulong)(pdVar2 + uVar30 * sVar29) >> 3) & 0x1fffffff) & 7),
             (long)uVar30 <= (long)uVar23)) {
            uVar23 = uVar30;
          }
          uVar24 = uVar30 - uVar23;
          uVar20 = uVar24 + 7;
          if (-1 < (long)uVar24) {
            uVar20 = uVar24;
          }
          if (0 < (long)uVar23) {
            uVar25 = 0;
            do {
              *(double *)((long)pdVar2 + uVar25 * 8 + uVar30 * lVar26) =
                   local_1c8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                   m_data.array[uVar25];
              uVar25 = uVar25 + 1;
            } while (uVar23 != uVar25);
          }
          uVar20 = (uVar20 & 0xfffffffffffffff8) + uVar23;
          if (7 < (long)uVar24) {
            do {
              dVar27 = local_1c8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                       m_storage.m_data.array[uVar23 + 1];
              dVar7 = local_1c8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                      m_storage.m_data.array[uVar23 + 2];
              dVar22 = (&local_1b0)[uVar23];
              ptVar8 = (&local_1a8)[uVar23];
              dVar31 = (&local_1a0)[uVar23];
              peVar9 = (&local_198.
                         super___shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr)[uVar23];
              p_Var10 = (&local_198.
                          super___shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_(__gnu_cxx::_Lock_policy)2>
                          ._M_refcount)[uVar23]._M_pi;
              pdVar1 = (double *)((long)pdVar2 + uVar23 * 8 + uVar30 * lVar26);
              *pdVar1 = local_1c8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                        m_storage.m_data.array[uVar23];
              pdVar1[1] = dVar27;
              pdVar1[2] = dVar7;
              pdVar1[3] = dVar22;
              pdVar1[4] = (double)ptVar8;
              pdVar1[5] = dVar31;
              pdVar1[6] = (double)peVar9;
              pdVar1[7] = (double)p_Var10;
              uVar23 = uVar23 + 8;
            } while ((long)uVar23 < (long)uVar20);
          }
          if ((long)uVar20 < (long)uVar30) {
            do {
              *(double *)((long)pdVar2 + uVar20 * 8 + uVar30 * lVar26) =
                   local_1c8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                   m_data.array[uVar20];
              uVar20 = uVar20 + 1;
            } while (uVar30 != uVar20);
          }
          sVar29 = sVar29 + 1;
          lVar26 = lVar26 + 8;
        } while (sVar29 != pointsPerCam);
      }
      in_ZMM4 = ZEXT1664(auVar32);
      std::
      vector<std::shared_ptr<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_std::allocator<std::shared_ptr<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>_>
      ::push_back(gt,&local_1d8);
      dVar27 = local_188;
      if (local_1d8.
          super___shared_ptr<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_1d8.
                   super___shared_ptr<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      rotation1 = (rotation_t *)0xaaaaaaaaaaaaaaab;
      uVar30 = (long)dVar27 + 1;
      pMVar17 = (local_1a8->
                super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      pMVar19 = (local_1a8->
                super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                )._M_impl.super__Vector_impl_data._M_finish;
    } while (uVar30 < (ulong)(((long)pMVar19 - (long)pMVar17 >> 3) * -0x5555555555555555));
  }
  if (pMVar19 != pMVar17) {
    local_170 = 0;
    local_140 = rotation2;
    do {
      local_1d8.
      super___shared_ptr<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)operator_new(0x18);
      ((DenseStorage<double,__1,__1,__1,_0> *)
      local_1d8.
      super___shared_ptr<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr)->m_cols = 0;
      ((DenseStorage<double,__1,__1,__1,_0> *)
      local_1d8.
      super___shared_ptr<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr)->m_data = (double *)0x0;
      ((DenseStorage<double,__1,__1,__1,_0> *)
      local_1d8.
      super___shared_ptr<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr)->m_rows = 0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<std::vector<Eigen::Matrix<double,3,1,0,3,1>,Eigen::aligned_allocator<Eigen::Matrix<double,3,1,0,3,1>>>*>
                (&local_1d8.
                  super___shared_ptr<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount,
                 (vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                  *)local_1d8.
                    super___shared_ptr<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr);
      local_198.
      super___shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (element_type *)operator_new(0x18);
      *(pointer *)
       ((long)local_198.
              super___shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr + 0x10) = (pointer)0x0;
      *(undefined8 *)
       local_198.
       super___shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_(__gnu_cxx::_Lock_policy)2>
       ._M_ptr = 0;
      *(pointer *)
       ((long)local_198.
              super___shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr + 8) = (pointer)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<std::vector<Eigen::Matrix<double,3,1,0,3,1>,Eigen::aligned_allocator<Eigen::Matrix<double,3,1,0,3,1>>>*>
                (&local_198.
                  super___shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount,
                 local_198.
                 super___shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr);
      if (pointsPerCam != 0) {
        dVar27 = 0.0;
        local_188 = 0.0;
        pMVar19 = (local_1a8->
                  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        lVar26 = local_170 * 0x10;
        pMVar17 = pMVar19 + local_170;
        local_168 = (pMVar17->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                    m_storage.m_data.array[0];
        dStack_160 = *(double *)
                      ((long)&(pMVar17->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                              ).m_storage.m_data + 8);
        local_f8 = *(double *)
                    ((long)&pMVar19[local_170].
                            super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                            m_data + 0x10);
        pMVar3 = (local_148->
                 super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        local_118 = *(undefined1 (*) [16])
                     ((long)&pMVar3[local_170].
                             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                             m_data + 0x18);
        pdVar2 = (double *)
                 ((long)&pMVar3[local_170].
                         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                         m_data + 0x30);
        local_138 = *pdVar2;
        dStack_130 = pdVar2[1];
        local_108 = pMVar3[local_170].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                    m_storage.m_data.array[0];
        dStack_100 = *(double *)
                      ((long)&pMVar3[local_170].
                              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                              .m_data + 8);
        auVar36._8_8_ = 0;
        auVar36._0_8_ =
             *(double *)
              ((long)&pMVar3[local_170].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                      .m_storage.m_data + 0x28);
        auVar32._8_8_ = 0;
        auVar32._0_8_ =
             *(double *)
              ((long)&pMVar3[local_170].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                      .m_storage.m_data + 0x10);
        local_128 = vunpcklpd_avx(auVar32,auVar36);
        local_1a0 = *(double *)
                     ((long)&pMVar3[local_170].
                             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                             m_data + 0x40);
        do {
          plVar4 = *(long **)(*(long *)gt + lVar26);
          lVar28 = *plVar4;
          lVar5 = plVar4[1];
          pvVar16 = malloc(0x58);
          if (pvVar16 == (void *)0x0) {
            puVar18 = (undefined8 *)__cxa_allocate_exception(8);
            *puVar18 = srand;
            __cxa_throw(puVar18,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
          }
          uVar30 = (ulong)pvVar16 & 0xffffffffffffffc0;
          lVar21 = 0;
          *(void **)(uVar30 + 0x38) = pvVar16;
          do {
            *(double *)(uVar30 + 0x40 + lVar21 * 8) =
                 *(double *)(lVar28 + lVar5 * (long)dVar27 + lVar21 * 8) -
                 (position1->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage
                 .m_data.array[lVar21];
            lVar21 = lVar21 + 1;
          } while (lVar21 != 3);
          local_c8 = *(double *)(uVar30 + 0x40);
          dStack_c0 = *(double *)(uVar30 + 0x48);
          local_a8 = local_c8 *
                     (local_90->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                     m_storage.m_data.array[3];
          dStack_a0 = dStack_c0 *
                      (local_90->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                      m_storage.m_data.array[4];
          local_158 = local_c8 *
                      (local_90->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                      m_storage.m_data.array[0];
          dStack_150 = dStack_c0 *
                       (local_90->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                       m_storage.m_data.array[1];
          local_c8 = local_c8 *
                     (local_90->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                     m_storage.m_data.array[6];
          dStack_c0 = dStack_c0 *
                      (local_90->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                      m_storage.m_data.array[7];
          local_b8 = *(double *)(uVar30 + 0x50);
          local_e8 = vmovhpd_avx(*(undefined1 (*) [16])
                                  ((local_90->
                                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                                   m_storage.m_data.array + 2),
                                 (local_90->
                                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                                 m_storage.m_data.array[5]);
          local_d8._0_8_ =
               local_b8 *
               (local_90->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
               m_data.array[8];
          dStack_b0 = local_b8;
          free(pvVar16);
          plVar4 = *(long **)(*(long *)gt + lVar26);
          lVar28 = *plVar4;
          lVar5 = plVar4[1];
          pvVar16 = malloc(0x58);
          rotation2 = local_140;
          if (pvVar16 == (void *)0x0) {
            puVar18 = (undefined8 *)__cxa_allocate_exception(8);
            *puVar18 = srand;
            __cxa_throw(puVar18,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
          }
          uVar30 = (ulong)pvVar16 & 0xffffffffffffffc0;
          lVar21 = 0;
          *(void **)(uVar30 + 0x38) = pvVar16;
          local_158 = local_158 + dStack_150 + (double)local_e8._0_8_ * local_b8;
          dStack_150 = local_a8 + dStack_a0 + (double)local_e8._8_8_ * dStack_b0;
          local_a8 = local_c8 + dStack_c0 + (double)local_d8._0_8_;
          do {
            *(double *)(uVar30 + 0x40 + lVar21 * 8) =
                 *(double *)(lVar28 + lVar5 * (long)dVar27 + lVar21 * 8) -
                 (position2->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage
                 .m_data.array[lVar21];
            lVar21 = lVar21 + 1;
          } while (lVar21 != 3);
          local_88 = *(double *)(uVar30 + 0x40);
          dStack_80 = *(double *)(uVar30 + 0x48);
          local_78 = local_88 *
                     (local_140->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                     m_storage.m_data.array[3];
          dStack_70 = dStack_80 *
                      (local_140->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                      m_storage.m_data.array[4];
          local_c8 = local_88 *
                     (local_140->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                     m_storage.m_data.array[0];
          dStack_c0 = dStack_80 *
                      (local_140->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                      m_storage.m_data.array[1];
          local_88 = local_88 *
                     (local_140->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                     m_storage.m_data.array[6];
          dStack_80 = dStack_80 *
                      (local_140->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                      m_storage.m_data.array[7];
          local_b8 = *(double *)(uVar30 + 0x50);
          local_d8 = vmovhps_avx(*(undefined1 (*) [16])
                                  ((local_140->
                                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                                   m_storage.m_data.array + 2),
                                 (local_140->
                                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                                 m_storage.m_data.array[5]);
          local_e8._0_8_ =
               local_b8 *
               (local_140->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
               m_data.array[8];
          dStack_b0 = local_b8;
          free(pvVar16);
          dVar22 = local_188;
          auVar15._8_8_ = dStack_150;
          auVar15._0_8_ = local_158;
          auVar13._8_8_ = dStack_160;
          auVar13._0_8_ = local_168;
          auVar32 = vsubpd_avx(auVar15,auVar13);
          dVar7 = local_a8 - local_f8;
          dVar31 = auVar32._0_8_;
          dVar35 = auVar32._8_8_;
          local_1c8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
          array[0] = dVar7 * (double)local_128._0_8_ + dVar31 * local_108 + dVar35 * dStack_100;
          local_1c8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
          array[1] = dVar7 * (double)local_128._8_8_ +
                     dVar31 * (double)local_118._0_8_ + dVar35 * (double)local_118._8_8_;
          local_1c8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
          array[2] = dVar7 * local_1a0 + dVar31 * local_138 + dVar35 * dStack_130;
          iVar6._M_current =
               *(Matrix<double,_3,_1,_0,_3,_1> **)
                ((long)local_1d8.
                       super___shared_ptr<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr + 8);
          if (iVar6._M_current ==
              *(Matrix<double,_3,_1,_0,_3,_1> **)
               ((long)local_1d8.
                      super___shared_ptr<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr + 0x10)) {
            std::
            vector<Eigen::Matrix<double,3,1,0,3,1>,Eigen::aligned_allocator<Eigen::Matrix<double,3,1,0,3,1>>>
            ::_M_realloc_insert<Eigen::Matrix<double,3,1,0,3,1>>
                      ((vector<Eigen::Matrix<double,3,1,0,3,1>,Eigen::aligned_allocator<Eigen::Matrix<double,3,1,0,3,1>>>
                        *)local_1d8.
                          super___shared_ptr<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr,iVar6,&local_1c8);
          }
          else {
            ((iVar6._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
            m_storage.m_data.array[2] =
                 local_1c8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                 m_data.array[2];
            ((iVar6._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
            m_storage.m_data.array[0] =
                 local_1c8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                 m_data.array[0];
            ((iVar6._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
            m_storage.m_data.array[1] =
                 local_1c8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                 m_data.array[1];
            *(Index *)((long)local_1d8.
                             super___shared_ptr<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr + 8) =
                 *(Index *)((long)local_1d8.
                                  super___shared_ptr<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr + 8) + 0x18;
          }
          dVar7 = (local_88 + dStack_80 + (double)local_e8._0_8_) - local_f8;
          auVar33._0_8_ = local_c8 + dStack_c0 + (double)local_d8._0_8_ * local_b8;
          auVar33._8_8_ = local_78 + dStack_70 + (double)local_d8._8_8_ * dStack_b0;
          auVar14._8_8_ = dStack_160;
          auVar14._0_8_ = local_168;
          auVar32 = vsubpd_avx(auVar33,auVar14);
          dVar31 = auVar32._0_8_;
          dVar35 = auVar32._8_8_;
          local_1c8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
          array[0] = dVar7 * (double)local_128._0_8_ + dVar31 * local_108 + dVar35 * dStack_100;
          local_1c8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
          array[1] = dVar7 * (double)local_128._8_8_ +
                     dVar31 * (double)local_118._0_8_ + dVar35 * (double)local_118._8_8_;
          local_1c8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
          array[2] = dVar7 * local_1a0 + dVar31 * local_138 + dVar35 * dStack_130;
          iVar6._M_current =
               *(Matrix<double,_3,_1,_0,_3,_1> **)
                ((long)local_198.
                       super___shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr + 8);
          if (iVar6._M_current ==
              *(Matrix<double,_3,_1,_0,_3,_1> **)
               ((long)local_198.
                      super___shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr + 0x10)) {
            std::
            vector<Eigen::Matrix<double,3,1,0,3,1>,Eigen::aligned_allocator<Eigen::Matrix<double,3,1,0,3,1>>>
            ::_M_realloc_insert<Eigen::Matrix<double,3,1,0,3,1>>
                      ((vector<Eigen::Matrix<double,3,1,0,3,1>,Eigen::aligned_allocator<Eigen::Matrix<double,3,1,0,3,1>>>
                        *)local_198.
                          super___shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr,iVar6,&local_1c8);
          }
          else {
            ((iVar6._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
            m_storage.m_data.array[2] =
                 local_1c8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                 m_data.array[2];
            ((iVar6._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
            m_storage.m_data.array[0] =
                 local_1c8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                 m_data.array[0];
            ((iVar6._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
            m_storage.m_data.array[1] =
                 local_1c8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                 m_data.array[1];
            *(long *)((long)local_198.
                            super___shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr + 8) =
                 *(long *)((long)local_198.
                                 super___shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr + 8) + 0x18;
          }
          lVar5 = (long)dVar22 * 0x18;
          pdVar2 = *(double **)
                    &(local_1d8.
                      super___shared_ptr<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr)->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>;
          auVar32 = *(undefined1 (*) [16])(pdVar2 + (long)dVar22 * 3);
          dVar7 = pdVar2[(long)dVar22 * 3 + 2];
          auVar37._8_8_ = 0;
          auVar37._0_8_ =
               dVar7 * dVar7 + auVar32._0_8_ * auVar32._0_8_ + auVar32._8_8_ * auVar32._8_8_;
          auVar36 = vsqrtpd_avx(auVar37);
          dVar31 = auVar36._0_8_;
          auVar43._8_8_ = dVar31;
          auVar43._0_8_ = dVar31;
          auVar32 = vdivpd_avx(auVar32,auVar43);
          *(undefined1 (*) [16])(pdVar2 + (long)dVar22 * 3) = auVar32;
          pdVar2[(long)dVar22 * 3 + 2] = dVar7 / dVar31;
          lVar28 = *(long *)local_198.
                            super___shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr;
          auVar32 = *(undefined1 (*) [16])(lVar28 + lVar5);
          dVar7 = *(double *)(lVar28 + 0x10 + lVar5);
          auVar38._8_8_ = 0;
          auVar38._0_8_ =
               dVar7 * dVar7 + auVar32._0_8_ * auVar32._0_8_ + auVar32._8_8_ * auVar32._8_8_;
          auVar36 = vsqrtpd_avx(auVar38);
          dVar31 = auVar36._0_8_;
          auVar44._8_8_ = dVar31;
          auVar44._0_8_ = dVar31;
          auVar32 = vdivpd_avx(auVar32,auVar44);
          *(undefined1 (*) [16])(lVar28 + lVar5) = auVar32;
          *(double *)(lVar28 + 0x10 + lVar5) = dVar7 / dVar31;
          if (0.0 < local_1b0) {
            pdVar2 = *(double **)
                      &(local_1d8.
                        super___shared_ptr<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr)->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> +
                     (long)dVar22 * 3;
            local_48.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
            array[0] = *pdVar2;
            local_48.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
            array[1] = pdVar2[1];
            local_48.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
            array[2] = (*(double **)
                         &(local_1d8.
                           super___shared_ptr<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr)->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                       )[(long)dVar22 * 3 + 2];
            local_158 = dVar27;
            addNoise(&local_1c8,local_1b0,&local_48);
            pdVar2 = *(double **)
                      &(local_1d8.
                        super___shared_ptr<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr)->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>;
            pdVar2[(long)dVar22 * 3 + 2] =
                 local_1c8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                 m_data.array[2];
            pdVar2 = pdVar2 + (long)dVar22 * 3;
            *pdVar2 = local_1c8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                      m_storage.m_data.array[0];
            pdVar2[1] = local_1c8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                        m_storage.m_data.array[1];
            pdVar2 = (double *)
                     (*(long *)local_198.
                               super___shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr + lVar5);
            local_68.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
            array[0] = *pdVar2;
            local_68.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
            array[1] = pdVar2[1];
            local_68.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
            array[2] = *(double *)
                        (*(long *)local_198.
                                  super___shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr + 0x10 + lVar5);
            addNoise(&local_1c8,local_1b0,&local_68);
            lVar28 = *(long *)local_198.
                              super___shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr;
            *(double *)(lVar28 + 0x10 + (long)dVar22 * 0x18) =
                 local_1c8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                 m_data.array[2];
            pdVar2 = (double *)(lVar28 + (long)dVar22 * 0x18);
            *pdVar2 = local_1c8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                      m_storage.m_data.array[0];
            pdVar2[1] = local_1c8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                        m_storage.m_data.array[1];
            dVar22 = local_188;
            dVar27 = local_158;
            rotation2 = local_140;
          }
          local_188 = (double)((long)dVar22 + 1);
          dVar27 = (double)((long)dVar27 + 8);
        } while (local_188 != (double)pointsPerCam);
      }
      std::
      vector<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>,_std::allocator<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>_>_>
      ::push_back(multiBearingVectors1,(value_type *)&local_1d8);
      std::
      vector<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>,_std::allocator<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>_>_>
      ::push_back(multiBearingVectors2,&local_198);
      if (local_198.
          super___shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_198.
                   super___shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      if (local_1d8.
          super___shared_ptr<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_1d8.
                   super___shared_ptr<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      pMVar17 = (local_1a8->
                super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      pMVar19 = (local_1a8->
                super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                )._M_impl.super__Vector_impl_data._M_finish;
      local_170 = local_170 + 1;
    } while (local_170 < (ulong)(((long)pMVar19 - (long)pMVar17 >> 3) * -0x5555555555555555));
    if (pMVar19 != pMVar17) {
      auVar32 = vcvtusi2sd_avx512f(in_ZMM4._0_16_,pointsPerCam);
      local_1a0 = 0.0;
      auVar34._8_8_ = 0;
      auVar34._0_8_ = auVar32._0_8_ * local_98;
      auVar32 = vroundsd_avx(auVar34,auVar34,9);
      dVar27 = (double)vcvttsd2usi_avx512f(auVar32);
      local_1b0 = dVar27;
      do {
        if (dVar27 != 0.0) {
          lVar26 = 0x10;
          local_188 = pMVar17[(long)local_1a0].
                      super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                      array[0];
          dStack_180 = pMVar17[(long)local_1a0].
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
                       .array[1];
          local_168 = pMVar17[(long)local_1a0].
                      super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                      array[2];
          pMVar3 = (local_148->
                   super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          lVar28 = (long)local_1a0 * 0x10;
          pdVar2 = (double *)
                   ((long)&pMVar3[(long)local_1a0].
                           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                           m_data + 0x18);
          local_108 = *pdVar2;
          dStack_100 = pdVar2[1];
          local_128 = *(undefined1 (*) [16])
                       ((long)&pMVar3[(long)local_1a0].
                               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                               m_storage.m_data + 0x30);
          local_f8 = pMVar3[(long)local_1a0].
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                     array[0];
          dStack_f0 = *(double *)
                       ((long)&pMVar3[(long)local_1a0].
                               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                               m_storage.m_data + 8);
          auVar45._8_8_ = 0;
          auVar45._0_8_ =
               *(double *)
                ((long)&pMVar3[(long)local_1a0].
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                        m_data + 0x28);
          auVar40._8_8_ = 0;
          auVar40._0_8_ =
               *(double *)
                ((long)&pMVar3[(long)local_1a0].
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                        m_data + 0x10);
          local_118 = vmovlhps_avx(auVar40,auVar45);
          local_138 = *(double *)
                       ((long)&pMVar3[(long)local_1a0].
                               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                               m_storage.m_data + 0x40);
          do {
            generateRandomPoint(&local_1c8,8.0,4.0);
            auVar11._8_8_ =
                 local_1c8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                 m_data.array[1];
            auVar11._0_8_ =
                 local_1c8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                 m_data.array[0];
            auVar36 = vsubpd_avx(auVar11,*(undefined1 (*) [16])
                                          (position2->
                                          super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                                          ).m_storage.m_data.array);
            dVar7 = local_1c8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage
                    .m_data.array[2] -
                    (position2->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                    m_storage.m_data.array[2];
            auVar32 = vmovhpd_avx(*(undefined1 (*) [16])
                                   ((rotation2->
                                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                                    m_storage.m_data.array + 2),
                                  (rotation2->
                                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                                  m_storage.m_data.array[5]);
            dVar22 = auVar36._0_8_;
            dVar31 = auVar36._8_8_;
            lVar5 = **(long **)(*(long *)multiBearingVectors2 + lVar28);
            auVar41._0_8_ =
                 dVar7 * auVar32._0_8_ +
                 dVar22 * (rotation2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                          m_storage.m_data.array[0] +
                 dVar31 * (rotation2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                          m_storage.m_data.array[1];
            auVar41._8_8_ =
                 dVar7 * auVar32._8_8_ +
                 dVar22 * (rotation2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                          m_storage.m_data.array[3] +
                 dVar31 * (rotation2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                          m_storage.m_data.array[4];
            auVar12._8_8_ = dStack_180;
            auVar12._0_8_ = local_188;
            auVar32 = vsubpd_avx(auVar41,auVar12);
            dVar35 = auVar32._0_8_;
            dVar42 = auVar32._8_8_;
            dVar7 = (dVar7 * (rotation2->
                             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                             .m_data.array[8] +
                    dVar22 * (rotation2->
                             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                             .m_data.array[6] +
                    dVar31 * (rotation2->
                             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                             .m_data.array[7]) - local_168;
            pdVar2 = (double *)(lVar5 + -0x10 + lVar26);
            *pdVar2 = dVar7 * (double)local_118._0_8_ + dVar35 * local_f8 + dVar42 * dStack_f0;
            pdVar2[1] = dVar7 * (double)local_118._8_8_ + dVar35 * local_108 + dVar42 * dStack_100;
            *(double *)(lVar5 + lVar26) =
                 dVar7 * local_138 +
                 dVar35 * (double)local_128._0_8_ + dVar42 * (double)local_128._8_8_;
            lVar5 = **(long **)(*(long *)multiBearingVectors2 + lVar28);
            auVar32 = *(undefined1 (*) [16])(lVar5 + -0x10 + lVar26);
            dVar7 = *(double *)(lVar5 + lVar26);
            auVar39._8_8_ = 0;
            auVar39._0_8_ =
                 dVar7 * dVar7 + auVar32._0_8_ * auVar32._0_8_ + auVar32._8_8_ * auVar32._8_8_;
            auVar36 = vsqrtpd_avx(auVar39);
            dVar22 = auVar36._0_8_;
            auVar46._8_8_ = dVar22;
            auVar46._0_8_ = dVar22;
            auVar32 = vdivpd_avx(auVar32,auVar46);
            *(undefined1 (*) [16])(lVar5 + -0x10 + lVar26) = auVar32;
            *(double *)(lVar5 + lVar26) = dVar7 / dVar22;
            lVar26 = lVar26 + 0x18;
            dVar27 = (double)((long)dVar27 + -1);
          } while (dVar27 != 0.0);
          pMVar17 = (local_1a8->
                    super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          pMVar19 = (local_1a8->
                    super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish;
          dVar27 = local_1b0;
        }
        local_1a0 = (double)((long)local_1a0 + 1);
      } while ((ulong)local_1a0 <
               (ulong)(((long)pMVar19 - (long)pMVar17 >> 3) * -0x5555555555555555));
    }
  }
  return;
}

Assistant:

void
opengv::generateMulti2D2DCorrespondences(
    const translation_t & position1,
    const rotation_t & rotation1,
    const translation_t & position2,
    const rotation_t & rotation2,
    const translations_t & camOffsets,
    const rotations_t & camRotations,
    size_t pointsPerCam,
    double noise,
    double outlierFraction,
    std::vector<std::shared_ptr<bearingVectors_t> > & multiBearingVectors1,
    std::vector<std::shared_ptr<bearingVectors_t> > & multiBearingVectors2,
    std::vector<std::shared_ptr<Eigen::MatrixXd> > & gt )
{
  //initialize point-cloud
  double minDepth = 4;
  double maxDepth = 8;

  for( size_t cam = 0; cam < camOffsets.size(); cam++ )
  {
    std::shared_ptr<Eigen::MatrixXd> gt_sub(new Eigen::MatrixXd(3,pointsPerCam));
    for( size_t i = 0; i < pointsPerCam; i++ )
      gt_sub->col(i) = generateRandomPoint( maxDepth, minDepth );
    gt.push_back(gt_sub);
  }

  //iterate through the cameras (pairs)
  for( size_t cam = 0; cam < camOffsets.size(); cam++ )
  {
    //create the bearing-vector arrays for this camera
    std::shared_ptr<bearingVectors_t> bearingVectors1(new bearingVectors_t());
    std::shared_ptr<bearingVectors_t> bearingVectors2(new bearingVectors_t());

    //get the offset and rotation of this camera
    translation_t camOffset = camOffsets[cam];
    rotation_t camRotation = camRotations[cam];

    //now iterate through the points of that camera
    for( size_t i = 0; i < (size_t) pointsPerCam; i++ )
    {
      //project a point into both viewpoint frames
      point_t bodyPoint1 = rotation1.transpose()*(gt[cam]->col(i) - position1);
      point_t bodyPoint2 = rotation2.transpose()*(gt[cam]->col(i) - position2);

      //project that point into the cameras
      bearingVectors1->push_back( camRotation.transpose()*(bodyPoint1 - camOffset) );
      bearingVectors2->push_back( camRotation.transpose()*(bodyPoint2 - camOffset) );

      //normalize the vectors
      (*bearingVectors1)[i] = (*bearingVectors1)[i] / (*bearingVectors1)[i].norm();
      (*bearingVectors2)[i] = (*bearingVectors2)[i] / (*bearingVectors2)[i].norm();

      //add noise
      if( noise > 0.0 )
      {
        (*bearingVectors1)[i] = addNoise(noise,(*bearingVectors1)[i]);
        (*bearingVectors2)[i] = addNoise(noise,(*bearingVectors2)[i]);
      }
    }

    //push back the stuff for this camera
    multiBearingVectors1.push_back(bearingVectors1);
    multiBearingVectors2.push_back(bearingVectors2);
  }

  //add outliers
  size_t outliersPerCam = (size_t) floor(outlierFraction*pointsPerCam);

  //iterate through the cameras
  for(size_t cam = 0; cam < camOffsets.size(); cam++)
  {
    //get the offset and rotation of this camera
    translation_t camOffset = camOffsets[cam];
    rotation_t camRotation = camRotations[cam];

    //add outliers
    for(size_t i = 0; i < outliersPerCam; i++)
    {
      //generate a random point
      point_t p = generateRandomPoint(8,4);

      //transform that point into viewpoint 2 only
      point_t bodyPoint = rotation2.transpose()*(p - position2);

      //use as measurement (outlier)
      (*multiBearingVectors2[cam])[i] =
          camRotation.transpose()*(bodyPoint - camOffset);

      //normalize
      (*multiBearingVectors2[cam])[i] =
          (*multiBearingVectors2[cam])[i] / (*multiBearingVectors2[cam])[i].norm();
    }
  }
}